

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primetest.cpp
# Opt level: O3

int64_t power(int a,int n,int mod)

{
  bool bVar1;
  undefined1 auVar2 [16];
  int64_t iVar3;
  long lVar4;
  
  if (n == 0) {
    iVar3 = 1;
  }
  else {
    lVar4 = (long)a;
    iVar3 = 1;
    do {
      if ((n & 1U) != 0) {
        iVar3 = (iVar3 * lVar4) % (long)mod;
      }
      auVar2._8_8_ = 0;
      auVar2._0_8_ = lVar4 * lVar4;
      lVar4 = SUB168(auVar2 % SEXT816((long)mod),0);
      bVar1 = 1 < (uint)n;
      n = n >> 1;
    } while (bVar1);
  }
  return iVar3;
}

Assistant:

int64_t power(int a, int n, int mod)
{
	int64_t power = a, result = 1;

	while (n)
	{
		if (n & 1)
			result = (result*power) % mod;
		power = (power*power) % mod;
		n >>= 1;
	}
	return result;
}